

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

uint stb_decompress(uchar *output,uchar *i,uint param_3)

{
  uint buflen;
  uint uVar1;
  byte *pbVar2;
  byte *in_RSI;
  uchar *in_RDI;
  uchar *old_i;
  uint olen;
  byte *local_18;
  
  if (((uint)*in_RSI * 0x1000000 +
       (uint)in_RSI[1] * 0x10000 + (uint)in_RSI[2] * 0x100 + (uint)in_RSI[3] == 0x57bc0000) &&
     ((uint)in_RSI[4] * 0x1000000 +
      (uint)in_RSI[5] * 0x10000 + (uint)in_RSI[6] * 0x100 + (uint)in_RSI[7] == 0)) {
    buflen = stb_decompress_length(in_RSI);
    stb__barrier_out_e = in_RDI + buflen;
    stb__barrier_in_b = in_RSI;
    stb__barrier_out_b = in_RDI;
    stb__dout = in_RDI;
    local_18 = in_RSI + 0x10;
    do {
      pbVar2 = stb_decompress_token((uchar *)0x151233);
      if (pbVar2 == local_18) {
        if ((*pbVar2 != 5) || (pbVar2[1] != 0xfa)) {
          return 0;
        }
        if (stb__dout != in_RDI + buflen) {
          return 0;
        }
        uVar1 = stb_adler32(1,in_RDI,buflen);
        if (uVar1 != (uint)pbVar2[2] * 0x1000000 +
                     (uint)pbVar2[3] * 0x10000 + (uint)pbVar2[4] * 0x100 + (uint)pbVar2[5]) {
          return 0;
        }
        return buflen;
      }
      local_18 = pbVar2;
    } while (stb__dout <= in_RDI + buflen);
  }
  return 0;
}

Assistant:

static unsigned int stb_decompress(unsigned char *output, const unsigned char *i, unsigned int /*length*/)
{
    if (stb__in4(0) != 0x57bC0000) return 0;
    if (stb__in4(4) != 0)          return 0; // error! stream is > 4GB
    const unsigned int olen = stb_decompress_length(i);
    stb__barrier_in_b = i;
    stb__barrier_out_e = output + olen;
    stb__barrier_out_b = output;
    i += 16;

    stb__dout = output;
    for (;;) {
        const unsigned char *old_i = i;
        i = stb_decompress_token(i);
        if (i == old_i) {
            if (*i == 0x05 && i[1] == 0xfa) {
                IM_ASSERT(stb__dout == output + olen);
                if (stb__dout != output + olen) return 0;
                if (stb_adler32(1, output, olen) != (unsigned int) stb__in4(2))
                    return 0;
                return olen;
            } else {
                IM_ASSERT(0); /* NOTREACHED */
                return 0;
            }
        }
        IM_ASSERT(stb__dout <= output + olen);
        if (stb__dout > output + olen)
            return 0;
    }
}